

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefNull
          (BinaryReaderIR *this,Index segment_index,Type type)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  char *__s;
  Offset OVar3;
  _func_int ***ppp_Var4;
  Expr *pEVar5;
  size_t sVar6;
  Expr *pEVar7;
  ExprList init_expr;
  intrusive_list<wabt::Expr> local_48;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U != (ulong)segment_index) {
    __assert_fail("segment_index == module_->elem_segments.size() - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                  ,0x519,
                  "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index, Type)"
                 );
  }
  pEVar2 = ppEVar1[segment_index];
  __s = this->filename_;
  sVar6 = strlen(__s);
  OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_48.size_ = 0;
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  pEVar7 = (Expr *)operator_new(0x48);
  (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar7->loc).filename._M_len = sVar6;
  (pEVar7->loc).filename._M_str = __s;
  (pEVar7->loc).field_1.field_1.offset = OVar3;
  *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = 0;
  pEVar7->type_ = RefNull;
  pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_0018d4c0;
  *(Type *)&pEVar7->field_0x3c = type;
  if (((pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar7->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar5 = pEVar7;
    if (local_48.last_ != (Expr *)0x0) {
      (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = local_48.last_;
      ((local_48.last_)->super_intrusive_list_base<wabt::Expr>).next_ = pEVar7;
      pEVar5 = local_48.first_;
    }
    local_48.first_ = pEVar5;
    local_48.size_ = local_48.size_ + 1;
    local_48.last_ = pEVar7;
    std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
    emplace_back<wabt::intrusive_list<wabt::Expr>>
              ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                *)&pEVar2->elem_exprs,&local_48);
    pEVar7 = local_48.first_;
    while (pEVar7 != (Expr *)0x0) {
      ppp_Var4 = &pEVar7->_vptr_Expr;
      pEVar7 = (pEVar7->super_intrusive_list_base<wabt::Expr>).next_;
      (*(*ppp_Var4)[1])();
    }
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                     Type type) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefNullExpr>(type, loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}